

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O3

void __thiscall
pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
          (PltFileManager *this,int a_lev,Geometry *a_level_geom,int pltComp,int dataComp,int nComp,
          MultiFab *a_mf)

{
  ulong uVar1;
  PltFileManager *pPVar2;
  Geometry *pGVar3;
  bool bVar4;
  int *piVar5;
  Periodicity *pPVar6;
  long lVar7;
  pointer pGVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  initializer_list<amrex::MultiFab_*> __l;
  initializer_list<double> __l_00;
  initializer_list<amrex::MultiFab_*> __l_01;
  initializer_list<double> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<double> __l_04;
  allocator_type local_442;
  allocator_type local_441;
  vector<double,_std::allocator<double>_> local_440;
  IntVect local_428;
  long local_418;
  ulong local_410;
  long local_408;
  long local_400;
  IntVect local_3f8;
  PltFileManager *local_3e8;
  Geometry *local_3e0;
  MultiFab *local_3d8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> dummyBCRec;
  IntVect local_398;
  double local_388;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> local_380;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> local_298;
  MultiFab temp;
  
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)nComp,
             (allocator_type *)&temp);
  piVar5 = (dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start)->bc + 3;
  lVar11 = 0;
  do {
    if (*(char *)((long)(a_level_geom->super_CoordSys).inv_dx + lVar11 + 0x19) == '\0') {
      if (0 < nComp) {
        lVar12 = 0;
        do {
          *(undefined4 *)((long)piVar5 + lVar12 + -0xc) = 2;
          *(undefined4 *)((long)piVar5 + lVar12) = 2;
          lVar12 = lVar12 + 0x18;
        } while ((ulong)(uint)nComp * 0x18 != lVar12);
      }
    }
    else if (0 < nComp) {
      lVar12 = 0;
      do {
        *(undefined4 *)((long)piVar5 + lVar12 + -0xc) = 0;
        *(undefined4 *)((long)piVar5 + lVar12) = 0;
        lVar12 = lVar12 + 0x18;
      } while ((ulong)(uint)nComp * 0x18 != lVar12);
    }
    lVar11 = lVar11 + 1;
    piVar5 = piVar5 + 1;
  } while (lVar11 != 3);
  local_410 = (ulong)(uint)nComp;
  local_3e8 = this;
  local_3e0 = a_level_geom;
  if (a_lev == 0) {
    bVar4 = amrex::RealBox::contains
                      (&((this->m_geoms).
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         _M_impl.super__Vector_impl_data._M_start)->prob_domain,
                       &a_level_geom->prob_domain,1e-07);
    if (!bVar4) {
      amrex::Assert_host("m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001)",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/PelePhysics/Utility/PltFileManager/PltFileManager.cpp"
                         ,0xd3,(char *)0x0);
    }
    pGVar8 = (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = (long)(((a_level_geom->domain).bigend.vect[0] - (a_level_geom->domain).smallend.vect[0])
                  + 1) /
            (long)(((pGVar8->domain).bigend.vect[0] - (pGVar8->domain).smallend.vect[0]) + 1);
    lVar11 = (long)(((a_level_geom->domain).bigend.vect[1] - (a_level_geom->domain).smallend.vect[1]
                    ) + 1) /
             (long)((*(int *)((long)&(pGVar8->domain).bigend + 4) -
                    *(int *)((long)&(pGVar8->domain).smallend + 4)) + 1);
    local_398.vect[2] =
         (((a_level_geom->domain).bigend.vect[2] - (a_level_geom->domain).smallend.vect[2]) + 1) /
         ((*(int *)((long)&(pGVar8->domain).bigend + 8) -
          *(int *)((long)&(pGVar8->domain).smallend + 8)) + 1);
    local_398.vect._0_8_ = lVar11 << 0x20 | uVar1 & 0xffffffff;
    iVar10 = (int)uVar1;
    iVar9 = (int)lVar11;
    if (((iVar10 == 1) && (iVar9 == 1)) && (local_398.vect[2] == 1)) {
      memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *
             )&temp,a_level_geom,200);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                 (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
                 &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_428.vect._0_8_ =
           (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_start;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_428;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_298,__l,
                 (allocator_type *)&local_3d8);
      local_3f8.vect[0] = 0;
      local_3f8.vect[1] = 0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_3f8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_380,__l_00,
                 (allocator_type *)&local_388);
      amrex::
      FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                (a_mf,(IntVect *)&local_440,0.0,
                 (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_298,
                 (Vector<double,_std::allocator<double>_> *)&local_380,pltComp,dataComp,nComp,
                 a_level_geom,
                 (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                  *)&temp,0);
      if ((pointer)local_380.m_geom.super_CoordSys._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_380.m_geom.super_CoordSys._0_8_,
                        (long)local_380.m_geom.super_CoordSys.offset[1] -
                        local_380.m_geom.super_CoordSys._0_8_);
      }
      if ((pointer)local_298.m_geom.super_CoordSys._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_298.m_geom.super_CoordSys._0_8_,
                        (long)local_298.m_geom.super_CoordSys.offset[1] -
                        local_298.m_geom.super_CoordSys._0_8_);
      }
      if (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_ != 0) {
        operator_delete((void *)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_,
                        (long)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.
                              m_dm_id.data -
                        temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_);
      }
    }
    else {
      if (iVar9 < iVar10) {
        iVar9 = iVar10;
      }
      if (iVar9 <= local_398.vect[2]) {
        iVar9 = local_398.vect[2];
      }
      if (iVar9 < 2) {
        amrex::Abort_host(
                         "When initializing dataFromPlt, our level 0 can\'t be coarser than the PltFile one"
                         );
      }
      else {
        memcpy(&temp,pGVar8,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        memcpy(&local_298,a_level_geom,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x0;
        local_380.m_geom.super_CoordSys.offset[0] =
             (Real)((ulong)local_380.m_geom.super_CoordSys.offset[0]._4_4_ << 0x20);
        amrex::
        InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                  (a_mf,(IntVect *)&local_380,0.0,
                   (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start,pltComp,dataComp,nComp,
                   (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start,a_level_geom,
                   (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)&temp,0,&local_298,0,&local_398,(InterpBase *)amrex::mf_cell_cons_interp,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                   (NullInterpHook<amrex::FArrayBox> *)&local_440,
                   (NullInterpHook<amrex::FArrayBox> *)&local_428);
        if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_ != 0) {
          operator_delete((void *)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_,
                          (long)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.
                                m_dm_id.data -
                          temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_);
        }
        pGVar8 = (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (200 < (long)(this->m_geoms).
                        super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pGVar8) {
          lVar11 = 200;
          lVar12 = 1;
          local_408 = 0x180;
          local_418 = 0x10;
          lVar13 = 0x68;
          do {
            uVar1 = (long)(((local_3e0->domain).bigend.vect[0] -
                           (local_3e0->domain).smallend.vect[0]) + 1) /
                    (long)((*(int *)((long)&(pGVar8->domain).bigend + lVar11) -
                           *(int *)((long)&(pGVar8->domain).smallend + lVar11)) + 1);
            lVar14 = (long)(((local_3e0->domain).bigend.vect[1] -
                            (local_3e0->domain).smallend.vect[1]) + 1) /
                     (long)((*(int *)((long)&(pGVar8->domain).bigend + lVar11 + 4U) -
                            *(int *)((long)&(pGVar8->domain).smallend + lVar11 + 4U)) + 1);
            local_3f8.vect[2] =
                 (((local_3e0->domain).bigend.vect[2] - (local_3e0->domain).smallend.vect[2]) + 1) /
                 ((*(int *)((long)&(pGVar8->domain).bigend + lVar11 + 8U) -
                  *(int *)((long)&(pGVar8->domain).smallend + lVar11 + 8U)) + 1);
            local_3f8.vect._0_8_ = lVar14 << 0x20 | uVar1 & 0xffffffff;
            if ((((int)uVar1 == 1) && ((int)lVar14 == 1)) && (local_3f8.vect[2] == 1)) {
              local_298.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
              local_298.m_geom.super_CoordSys.offset[0] = 0.0;
              local_298.m_geom.super_CoordSys.offset[1] = 0.0;
              local_298.m_geom.super_CoordSys.offset[2] = 0.0;
              local_298.m_geom.super_CoordSys.dx[0] = 0.0;
              local_380.m_geom.super_CoordSys._0_8_ = &PTR__FabFactory_00712918;
              iVar9 = (int)local_410;
              amrex::MultiFab::MultiFab
                        (&temp,(BoxArray *)
                               ((long)&(((this->m_grids).
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         .
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_bat).
                                       m_bat_type + lVar13),
                         (DistributionMapping *)
                         ((long)&(((this->m_dmaps).
                                   super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   .
                                   super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                         + local_418),iVar9,0,(MFInfo *)&local_298,
                         (FabFactory<amrex::FArrayBox> *)&local_380);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_298.m_geom.super_CoordSys.offset + 1));
              memcpy(&local_298,
                     (void *)((long)(((this->m_geoms).
                                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      .
                                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                    offset + lVar11 + 0xfffffffffffffff8U),200);
              std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                        (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                         &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
              local_428.vect._0_8_ = (pointer)0x0;
              local_428.vect[2] = 0;
              local_3d8 = (MultiFab *)
                          ((long)&(((this->m_data).
                                    super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_408);
              __l_03._M_len = 1;
              __l_03._M_array = &local_3d8;
              std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                        ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380
                         ,__l_03,&local_441);
              local_388 = 0.0;
              __l_04._M_len = 1;
              __l_04._M_array = &local_388;
              std::vector<double,_std::allocator<double>_>::vector(&local_440,__l_04,&local_442);
              amrex::
              FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                        (&temp,&local_428,0.0,
                         (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380
                         ,(Vector<double,_std::allocator<double>_> *)&local_440,pltComp,0,iVar9,
                         (Geometry *)
                         ((long)(((this->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar11 + 0xfffffffffffffff8U),&local_298,0);
              if (local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_440.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_440.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_440.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((pointer)local_380.m_geom.super_CoordSys._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_380.m_geom.super_CoordSys._0_8_,
                                (long)local_380.m_geom.super_CoordSys.offset[1] -
                                local_380.m_geom.super_CoordSys._0_8_);
              }
              pPVar6 = amrex::Periodicity::NonPeriodic();
              local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x0;
              local_380.m_geom.super_CoordSys.offset[0] =
                   (Real)((ulong)local_380.m_geom.super_CoordSys.offset[0] & 0xffffffff00000000);
              local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                        (&a_mf->super_FabArray<amrex::FArrayBox>,
                         &temp.super_FabArray<amrex::FArrayBox>,0,dataComp,iVar9,
                         (IntVect *)&local_380,(IntVect *)&local_440,pPVar6,COPY,(CPC *)0x0,false);
              if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_298.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_298.m_bcr.
                                      super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_003bc5ae;
            }
            amrex::refine((BoxArray *)&local_298,
                          (BoxArray *)
                          ((long)&(((this->m_grids).
                                    super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                          lVar13),&local_3f8);
            local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
            local_380.m_geom.super_CoordSys.offset[2] = 0.0;
            local_380.m_geom.super_CoordSys.dx[0] = 0.0;
            local_380.m_geom.super_CoordSys.offset[0] = 0.0;
            local_380.m_geom.super_CoordSys.offset[1] = 0.0;
            local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_00712918;
            amrex::MultiFab::MultiFab
                      (&temp,(BoxArray *)&local_298,
                       (DistributionMapping *)
                       ((long)&(((this->m_dmaps).
                                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 .
                                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                       + local_418),(int)local_410,0,(MFInfo *)&local_380,
                       (FabFactory<amrex::FArrayBox> *)&local_440);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_380.m_geom.super_CoordSys.offset + 1));
            amrex::BoxArray::~BoxArray((BoxArray *)&local_298);
            local_400 = lVar11;
            memcpy(&local_298,
                   (void *)((long)(((this->m_geoms).
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                  offset + lVar11 + 0xfffffffffffffff8U),200);
            std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                      (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                       &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
            pGVar3 = local_3e0;
            memcpy(&local_380,local_3e0,200);
            std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                      (&local_380.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                       &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
            local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            iVar9 = (int)local_410;
            amrex::
            InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                      (&temp,(IntVect *)&local_440,0.0,
                       (MultiFab *)
                       ((long)&(((this->m_data).
                                 super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                 super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_408),
                       pltComp,0,iVar9,
                       (Geometry *)
                       ((long)(((this->m_geoms).
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                       local_400 + 0xfffffffffffffff8U),pGVar3,&local_298,0,&local_380,0,&local_3f8,
                       (InterpBase *)amrex::mf_cell_cons_interp,
                       (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                       &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                       (NullInterpHook<amrex::FArrayBox> *)&local_428,
                       (NullInterpHook<amrex::FArrayBox> *)&local_3d8);
            pPVar6 = amrex::Periodicity::NonPeriodic();
            local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 0;
            local_428.vect._0_8_ = (pointer)0x0;
            local_428.vect[2] = 0;
            amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                      (&a_mf->super_FabArray<amrex::FArrayBox>,
                       &temp.super_FabArray<amrex::FArrayBox>,0,dataComp,iVar9,(IntVect *)&local_440
                       ,&local_428,pPVar6,COPY,(CPC *)0x0,false);
            this = local_3e8;
            lVar11 = local_400;
            if (local_380.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_380.m_bcr.
                              super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_380.m_bcr.
                                    super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_380.m_bcr.
                                    super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_298.m_bcr.
                              super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_298.m_bcr.
                                    super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_298.m_bcr.
                                    super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            amrex::MultiFab::~MultiFab(&temp);
            lVar12 = lVar12 + 1;
            pGVar8 = (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                     .super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar14 = ((long)(this->m_geoms).
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pGVar8 >> 3) *
                     -0x70a3d70a3d70a3d7;
            lVar11 = lVar11 + 200;
            local_408 = local_408 + 0x180;
            local_418 = local_418 + 0x10;
            lVar13 = lVar13 + 0x68;
          } while (lVar14 - lVar12 != 0 && lVar12 <= lVar14);
        }
      }
    }
  }
  else {
    pGVar8 = (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_398.vect[2] =
         (((a_level_geom->domain).bigend.vect[2] - (a_level_geom->domain).smallend.vect[2]) + 1) /
         ((*(int *)((long)&(pGVar8->domain).bigend + 8) -
          *(int *)((long)&(pGVar8->domain).smallend + 8)) + 1);
    local_398.vect._0_8_ =
         (long)(((a_level_geom->domain).bigend.vect[1] - (a_level_geom->domain).smallend.vect[1]) +
               1) /
         (long)((*(int *)((long)&(pGVar8->domain).bigend + 4) -
                *(int *)((long)&(pGVar8->domain).smallend + 4)) + 1) << 0x20 |
         (long)(((a_level_geom->domain).bigend.vect[0] - (a_level_geom->domain).smallend.vect[0]) +
               1) /
         (long)(((pGVar8->domain).bigend.vect[0] - (pGVar8->domain).smallend.vect[0]) + 1) &
         0xffffffffU;
    memcpy(&temp,pGVar8,200);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
    memcpy(&local_298,a_level_geom,200);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
    local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x0;
    local_380.m_geom.super_CoordSys.offset[0] =
         (Real)((ulong)local_380.m_geom.super_CoordSys.offset[0]._4_4_ << 0x20);
    amrex::
    InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
              (a_mf,(IntVect *)&local_380,0.0,
               (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start,pltComp,dataComp,nComp,
               (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start,a_level_geom,
               (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                *)&temp,0,&local_298,0,&local_398,(InterpBase *)amrex::mf_cell_cons_interp,
               (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
               (NullInterpHook<amrex::FArrayBox> *)&local_440,
               (NullInterpHook<amrex::FArrayBox> *)&local_428);
    if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
        super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_ != 0) {
      operator_delete((void *)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_,
                      (long)temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.m_bdkey.m_dm_id
                            .data - temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._200_8_
                     );
    }
    pGVar8 = (this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
             super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (200 < (long)(this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pGVar8) {
      lVar12 = 200;
      lVar14 = 1;
      local_418 = 0x180;
      lVar11 = 0x10;
      lVar13 = 0x68;
      do {
        pPVar2 = local_3e8;
        uVar1 = (long)(((local_3e0->domain).bigend.vect[0] - (local_3e0->domain).smallend.vect[0]) +
                      1) /
                (long)((*(int *)((long)&(pGVar8->domain).bigend + lVar12) -
                       *(int *)((long)&(pGVar8->domain).smallend + lVar12)) + 1);
        lVar7 = (long)(((local_3e0->domain).bigend.vect[1] - (local_3e0->domain).smallend.vect[1]) +
                      1) /
                (long)((*(int *)((long)&(pGVar8->domain).bigend + lVar12 + 4U) -
                       *(int *)((long)&(pGVar8->domain).smallend + lVar12 + 4U)) + 1);
        local_3f8.vect[2] =
             (((local_3e0->domain).bigend.vect[2] - (local_3e0->domain).smallend.vect[2]) + 1) /
             ((*(int *)((long)&(pGVar8->domain).bigend + lVar12 + 8U) -
              *(int *)((long)&(pGVar8->domain).smallend + lVar12 + 8U)) + 1);
        local_3f8.vect._0_8_ = lVar7 << 0x20 | uVar1 & 0xffffffff;
        if ((((int)uVar1 == 1) && ((int)lVar7 == 1)) && (local_3f8.vect[2] == 1)) {
          local_298.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
          local_298.m_geom.super_CoordSys.offset[0] = 0.0;
          local_298.m_geom.super_CoordSys.offset[1] = 0.0;
          local_298.m_geom.super_CoordSys.offset[2] = 0.0;
          local_298.m_geom.super_CoordSys.dx[0] = 0.0;
          local_380.m_geom.super_CoordSys._0_8_ = &PTR__FabFactory_00712918;
          iVar9 = (int)local_410;
          amrex::MultiFab::MultiFab
                    (&temp,(BoxArray *)
                           ((long)&(((local_3e8->m_grids).
                                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     .
                                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                           lVar13),
                     (DistributionMapping *)
                     ((long)&(((local_3e8->m_dmaps).
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               .
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     + lVar11),iVar9,0,(MFInfo *)&local_298,
                     (FabFactory<amrex::FArrayBox> *)&local_380);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_298.m_geom.super_CoordSys.offset + 1));
          memcpy(&local_298,
                 (void *)((long)(((pPVar2->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar12 + 0xfffffffffffffff8U),200);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                     &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
          local_428.vect._0_8_ = (pointer)0x0;
          local_428.vect[2] = 0;
          local_3d8 = (MultiFab *)
                      ((long)&(((pPVar2->m_data).
                                super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_418);
          __l_01._M_len = 1;
          __l_01._M_array = &local_3d8;
          std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380,
                     __l_01,&local_441);
          local_388 = 0.0;
          __l_02._M_len = 1;
          __l_02._M_array = &local_388;
          std::vector<double,_std::allocator<double>_>::vector(&local_440,__l_02,&local_442);
          amrex::
          FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                    (&temp,&local_428,0.0,
                     (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380,
                     (Vector<double,_std::allocator<double>_> *)&local_440,pltComp,0,iVar9,
                     (Geometry *)
                     ((long)(((pPVar2->m_geoms).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar12 + 0xfffffffffffffff8U),&local_298,0);
          if (local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_440.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_440.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_380.m_geom.super_CoordSys._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_380.m_geom.super_CoordSys._0_8_,
                            (long)local_380.m_geom.super_CoordSys.offset[1] -
                            local_380.m_geom.super_CoordSys._0_8_);
          }
          pPVar6 = amrex::Periodicity::NonPeriodic();
          local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x0;
          local_380.m_geom.super_CoordSys.offset[0] =
               (Real)((ulong)local_380.m_geom.super_CoordSys.offset[0] & 0xffffffff00000000);
          local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ = 0;
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                    (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,
                     0,dataComp,iVar9,(IntVect *)&local_380,(IntVect *)&local_440,pPVar6,COPY,
                     (CPC *)0x0,false);
          if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_298.m_bcr.
                            super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_298.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_298.m_bcr.
                                  super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
LAB_003bc5ae:
          amrex::MultiFab::~MultiFab(&temp);
          break;
        }
        amrex::refine((BoxArray *)&local_298,
                      (BoxArray *)
                      ((long)&(((local_3e8->m_grids).
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                      lVar13),&local_3f8);
        local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
        local_380.m_geom.super_CoordSys.offset[2] = 0.0;
        local_380.m_geom.super_CoordSys.dx[0] = 0.0;
        local_380.m_geom.super_CoordSys.offset[0] = 0.0;
        local_380.m_geom.super_CoordSys.offset[1] = 0.0;
        local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_00712918;
        local_408 = lVar11;
        amrex::MultiFab::MultiFab
                  (&temp,(BoxArray *)&local_298,
                   (DistributionMapping *)
                   ((long)&(((pPVar2->m_dmaps).
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             .
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                   + lVar11),(int)local_410,0,(MFInfo *)&local_380,
                   (FabFactory<amrex::FArrayBox> *)&local_440);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_380.m_geom.super_CoordSys.offset + 1));
        amrex::BoxArray::~BoxArray((BoxArray *)&local_298);
        local_400 = lVar12;
        memcpy(&local_298,
               (void *)((long)(((pPVar2->m_geoms).
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                       lVar12 + 0xfffffffffffffff8U),200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  (&local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        pGVar3 = local_3e0;
        memcpy(&local_380,local_3e0,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  (&local_380.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        iVar9 = (int)local_410;
        amrex::
        InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                  (&temp,(IntVect *)&local_440,0.0,
                   (MultiFab *)
                   ((long)&(((pPVar2->m_data).
                             super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                             _M_impl.super__Vector_impl_data._M_start)->
                           super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_418),pltComp
                   ,0,iVar9,(Geometry *)
                            ((long)(((pPVar2->m_geoms).
                                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     .
                                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                   offset + local_400 + 0xfffffffffffffff8U),pGVar3,&local_298,0,
                   &local_380,0,&local_3f8,(InterpBase *)amrex::mf_cell_cons_interp,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                   (NullInterpHook<amrex::FArrayBox> *)&local_428,
                   (NullInterpHook<amrex::FArrayBox> *)&local_3d8);
        pPVar6 = amrex::Periodicity::NonPeriodic();
        local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_440.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_428.vect._0_8_ = (pointer)0x0;
        local_428.vect[2] = 0;
        amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                  (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,0,
                   dataComp,iVar9,(IntVect *)&local_440,&local_428,pPVar6,COPY,(CPC *)0x0,false);
        lVar12 = local_400;
        lVar11 = local_408;
        if (local_380.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_380.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_380.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_380.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_298.m_bcr.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.m_bcr.
                                super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        amrex::MultiFab::~MultiFab(&temp);
        lVar14 = lVar14 + 1;
        pGVar8 = (local_3e8->m_geoms).
                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar7 = ((long)(local_3e8->m_geoms).
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pGVar8 >> 3) * -0x70a3d70a3d70a3d7
        ;
        lVar12 = lVar12 + 200;
        local_418 = local_418 + 0x180;
        lVar11 = lVar11 + 0x10;
        lVar13 = lVar13 + 0x68;
      } while (lVar7 - lVar14 != 0 && lVar14 <= lVar7);
    }
  }
  if (dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
PltFileManager::fillPatchFromPlt(
  int a_lev,
  const Geometry& a_level_geom,
  int pltComp,
  int dataComp,
  int nComp,
  MultiFab& a_mf)
{
  Vector<BCRec> dummyBCRec(nComp);
  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    if (a_level_geom.isPeriodic(idim)) {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::int_dir);
        dummyBCRec[n].setHi(idim, BCType::int_dir);
      }
    } else {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::foextrap);
        dummyBCRec[n].setHi(idim, BCType::foextrap);
      }
    }
  }

  // There might be a number of problems related to proper nesting of the
  // current BA and the PltFile BA. Try to address some of those, but need
  // further testing.

  if (a_lev == 0) {
    // Ensure that the provided level 0 geometry is contained in the one
    // we've read from the pltfile
    AMREX_ALWAYS_ASSERT(
      m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001));

    // Check the refRatio between PltFile level 0 and ours
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Same domain size, just do a fill patch single level
    if (lev0rr == IntVect::TheUnitVector()) {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      FillPatchSingleLevel(
        a_mf, IntVect(0), 0.0, {&(m_data[a_lev])}, {0.0}, pltComp, dataComp,
        nComp, a_level_geom, bndry_func, 0);

      // Our level 0 is finer than the PltFile one.
    } else if (lev0rr.max() > 1) {

      // Interpolator (need EB version ?)
      InterpBase* mapper = &mf_cell_cons_interp;

      // Start by filling all the data with a coarseInterp. We've checked that
      // the geom RealBoxes match already, so PltFile level 0 is good to interp.
      {
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp,
          m_geoms[0], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          lev0rr, mapper, {dummyBCRec}, 0);
      }

      // Then get data from the PltFile finer levels if any
      for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

        IntVect rr =
          a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

        // Current Plt level resolution matches our: lets interp and wrap it up
        if (rr == IntVect::TheUnitVector()) {
          MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
          PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
            m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
          FillPatchSingleLevel(
            temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
            m_geoms[pltlev], bndry_func, 0);

          a_mf.ParallelCopy(temp, 0, dataComp, nComp);

          break;
        }

        // Otherwise do another InterpFromCoarseLevel
        MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
          m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          rr, mapper, {dummyBCRec}, 0);
        a_mf.ParallelCopy(temp, 0, dataComp, nComp);
      }

    } else {
      // Otherwise bail out because we don't handle averaging_down (TODO ?)
      Abort("When initializing dataFromPlt, our level 0 can't be coarser than "
            "the PltFile one");
    }
  } else {
    // Check the refRatio between PltFile level 0 and the current level
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Interpolator (need EB version ?)
    InterpBase* mapper = &mf_cell_cons_interp;

    // Start by filling the entire level with level 0 from PltFile, to ensure we
    // have some data everywhere
    {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp, m_geoms[0],
        a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0, lev0rr, mapper,
        {dummyBCRec}, 0);
    }

    // Then get data from the PltFile finer levels if any
    for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

      IntVect rr =
        a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

      // Current Plt level resolution matches our: lets interp and wrap it up
      if (rr == IntVect::TheUnitVector()) {
        MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        FillPatchSingleLevel(
          temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
          m_geoms[pltlev], bndry_func, 0);

        a_mf.ParallelCopy(temp, 0, dataComp, nComp);

        break;
      }

      // Otherwise do another InterpFromCoarseLevel
      MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
        m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
        rr, mapper, {dummyBCRec}, 0);
      a_mf.ParallelCopy(temp, 0, dataComp, nComp);
    }
  }
}